

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void glob_verifyquit(void *dummy,t_floatarg f)

{
  _glist *p_Var1;
  t_symbol *ptVar2;
  char local_88 [8];
  char buf [40];
  undefined4 local_58 [2];
  t_atom backmsg [2];
  char *local_30;
  char *msg;
  _glist *g2;
  _glist *g;
  void *pvStack_10;
  t_floatarg f_local;
  void *dummy_local;
  
  local_30 = "really quit?";
  g._4_4_ = f;
  pvStack_10 = dummy;
  g2 = pd_getcanvaslist();
  while( true ) {
    if (g2 == (_glist *)0x0) {
      if (((g._4_4_ != 0.0) || (NAN(g._4_4_))) || (sys_perf == 0)) {
        glob_quit((void *)0x0);
      }
      else {
        pdgui_vmess("pdtk_check","r Sss",".pdwindow",1,&local_30,"pd quit","yes");
      }
      return;
    }
    msg = (char *)glist_finddirty(g2);
    if ((_glist *)msg != (_glist *)0x0) break;
    g2 = g2->gl_next;
    msg = (char *)0x0;
  }
  sprintf(local_88,".x%lx",msg);
  local_58[0] = 2;
  backmsg[0]._0_8_ = gensym("menuclose");
  backmsg[0].a_w.w_float = 1.4013e-45;
  backmsg[1].a_type = 0x40400000;
  canvas_vis((_glist *)msg,1.0);
  p_Var1 = canvas_getrootfor(g2);
  ptVar2 = gensym(local_88);
  pdgui_vmess("pdtk_canvas_menuclose","^m",p_Var1,ptVar2,2,local_58);
  return;
}

Assistant:

void glob_verifyquit(void *dummy, t_floatarg f)
{
    t_glist *g, *g2;
    const char*msg = "really quit?";
        /* find all root canvases */
    for (g = pd_getcanvaslist(); g; g = g->gl_next)
        if ((g2 = glist_finddirty(g)))
        {
            t_atom backmsg[2];
            char buf[40];
            sprintf(buf, ".x%lx", g2);
            SETSYMBOL(backmsg+0, gensym("menuclose"));
            SETFLOAT (backmsg+1, 3);

            canvas_vis(g2, 1);
            pdgui_vmess("pdtk_canvas_menuclose", "^m",
                        canvas_getrootfor(g),
                        gensym(buf), 2, backmsg);
            return;
        }
    if (f == 0 && sys_perf)
        pdgui_vmess("pdtk_check", "r Sss",
            ".pdwindow",
            1, &msg,
            "pd quit", "yes");
    else glob_quit(0);
}